

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dont_underflow_cpp.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  size_type sVar1;
  size_t pos;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string str;
  char **argv_local;
  int argc_local;
  
  __s = argv[1];
  str.field_2._8_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
                       ,':',0xffffffffffffffff);
  if (sVar1 != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               sVar1 + 1,0xffffffffffffffff);
  }
  std::__cxx11::string::~string((string *)local_38);
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
  std::string str = argv[1];
  size_t pos = str.find_last_of(':');
  if (pos != std::string::npos)
    str.erase(pos + 1);
}